

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdapi_transaction_base.cpp
# Opt level: O0

Script * cfd::api::SetP2shMultisigUnlockingScript
                   (vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>
                    *signature_data,Script *redeem_script)

{
  bool bVar1;
  reference data;
  Script *in_RDX;
  vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> *in_RSI;
  Script *in_RDI;
  ByteData *signature;
  const_iterator __end2;
  const_iterator __begin2;
  vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> *__range2;
  ScriptBuilder sb;
  __normal_iterator<const_cfd::core::ByteData_*,_std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>_>
  local_60;
  __normal_iterator<const_cfd::core::ByteData_*,_std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>_>
  local_58;
  vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> *local_50;
  ScriptBuilder local_38;
  Script *local_18;
  vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> *local_10;
  
  local_18 = in_RDX;
  local_10 = in_RSI;
  core::ScriptBuilder::ScriptBuilder((ScriptBuilder *)0x544f15);
  core::ScriptBuilder::AppendOperator(&local_38,(ScriptOperator *)core::ScriptOperator::OP_0);
  local_50 = local_10;
  local_58._M_current =
       (ByteData *)
       std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::begin(local_10);
  local_60._M_current =
       (ByteData *)
       std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::end(local_50);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=(&local_58,&local_60);
    if (!bVar1) break;
    data = __gnu_cxx::
           __normal_iterator<const_cfd::core::ByteData_*,_std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>_>
           ::operator*(&local_58);
    core::ScriptBuilder::AppendData(&local_38,data);
    __gnu_cxx::
    __normal_iterator<const_cfd::core::ByteData_*,_std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>_>
    ::operator++(&local_58);
  }
  core::ScriptBuilder::AppendData(&local_38,local_18);
  core::ScriptBuilder::Build(in_RDI,&local_38);
  core::ScriptBuilder::~ScriptBuilder((ScriptBuilder *)0x544fd9);
  return in_RDI;
}

Assistant:

static Script SetP2shMultisigUnlockingScript(
    const std::vector<ByteData>& signature_data, const Script& redeem_script) {
  ScriptBuilder sb;
  sb.AppendOperator(ScriptOperator::OP_0);
  for (const ByteData& signature : signature_data) {
    sb.AppendData(signature);
  }
  sb.AppendData(redeem_script);
  return sb.Build();
}